

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * MemBackendPoolAlloc(SyMemBackend *pBackend,sxu32 nByte)

{
  sxi32 sVar1;
  undefined4 *puVar2;
  uint local_38;
  sxi32 rc;
  sxu32 nBucket;
  sxu32 nBucketSize;
  SyMemHeader *pNext;
  SyMemHeader *pBucket;
  sxu32 nByte_local;
  SyMemBackend *pBackend_local;
  
  if ((ulong)nByte + 8 < 0x8000) {
    local_38 = 0;
    for (rc = 8; (ulong)(uint)rc < (ulong)nByte + 8; rc = rc << 1) {
      local_38 = local_38 + 1;
    }
    pNext = pBackend->apPool[local_38];
    if (pNext == (SyMemHeader *)0x0) {
      sVar1 = MemPoolBucketAlloc(pBackend,local_38);
      if (sVar1 != 0) {
        return (void *)0x0;
      }
      pNext = pBackend->apPool[local_38];
    }
    *(SyMemHeader *)(pBackend->apPool + local_38) = *pNext;
    pNext->nBucket = local_38 | 0xdead0000;
    pBackend_local = (SyMemBackend *)(pNext + 1);
  }
  else {
    puVar2 = (undefined4 *)MemBackendAlloc(pBackend,nByte + 8);
    if (puVar2 == (undefined4 *)0x0) {
      pBackend_local = (SyMemBackend *)0x0;
    }
    else {
      *puVar2 = 0xdeadffff;
      pBackend_local = (SyMemBackend *)(puVar2 + 2);
    }
  }
  return pBackend_local;
}

Assistant:

static void * MemBackendPoolAlloc(SyMemBackend *pBackend, sxu32 nByte)
{
	SyMemHeader *pBucket, *pNext;
	sxu32 nBucketSize;
	sxu32 nBucket;

	if( nByte + sizeof(SyMemHeader) >= SXMEM_POOL_MAXALLOC ){
		/* Allocate a big chunk directly */
		pBucket = (SyMemHeader *)MemBackendAlloc(&(*pBackend), nByte+sizeof(SyMemHeader));
		if( pBucket == 0 ){
			return 0;
		}
		/* Record as big block */
		pBucket->nBucket = (sxu32)(SXMEM_POOL_MAGIC << 16) | SXU16_HIGH;
		return (void *)(pBucket+1);
	}
	/* Locate the appropriate bucket */
	nBucket = 0;
	nBucketSize = SXMEM_POOL_MINALLOC;
	while( nByte + sizeof(SyMemHeader) > nBucketSize  ){
		nBucketSize <<= 1;
		nBucket++;
	}
	pBucket = pBackend->apPool[nBucket];
	if( pBucket == 0 ){
		sxi32 rc;
		rc = MemPoolBucketAlloc(&(*pBackend), nBucket);
		if( rc != SXRET_OK ){
			return 0;
		}
		pBucket = pBackend->apPool[nBucket];
	}
	/* Remove from the free list */
	pNext = pBucket->pNext;
	pBackend->apPool[nBucket] = pNext;
	/* Record bucket&magic number */
	pBucket->nBucket = (SXMEM_POOL_MAGIC << 16) | nBucket;
	return (void *)&pBucket[1];
}